

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeSliceLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  bool bVar1;
  undefined8 uVar2;
  SliceLayerParams_SliceAxis SVar3;
  int iVar4;
  string *psVar5;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar6;
  SliceLayerParams *from;
  int64_t iVar7;
  uint64_t uVar8;
  runtime_error *prVar9;
  ShapeRange local_108;
  ShapeRange local_e8;
  undefined1 local_c8 [8];
  ShapeRange outrange;
  ShapeRange size;
  SliceLayerParams_SliceAxis local_80;
  int iStack_7c;
  bool fixedSize;
  int inLowerBound;
  int outsize;
  SliceLayerParams_SliceAxis axis;
  int stride;
  int end;
  int local_5c;
  undefined1 local_58 [4];
  int start;
  SliceLayerParams slice;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar5 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar5);
  psVar5 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar5);
  slice._40_8_ = this_01;
  psVar5 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(this_01,psVar5);
  uVar2 = slice._40_8_;
  pSVar6 = ShapeConstraint::sequenceRange(this_00);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)uVar2,pSVar6);
  uVar2 = slice._40_8_;
  pSVar6 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)uVar2,pSVar6);
  pSVar6 = ShapeConstraint::sequenceRange((ShapeConstraint *)slice._40_8_);
  ShapeConstraint::updateSequenceRange(this_00,pSVar6);
  pSVar6 = ShapeConstraint::batchRange((ShapeConstraint *)slice._40_8_);
  ShapeConstraint::updateBatchRange(this_00,pSVar6);
  from = Specification::NeuralNetworkLayer::slice(specLayer);
  Specification::SliceLayerParams::SliceLayerParams((SliceLayerParams *)local_58,from);
  iVar7 = Specification::SliceLayerParams::startindex((SliceLayerParams *)local_58);
  local_5c = (int)iVar7;
  iVar7 = Specification::SliceLayerParams::endindex((SliceLayerParams *)local_58);
  axis = (SliceLayerParams_SliceAxis)iVar7;
  uVar8 = Specification::SliceLayerParams::stride((SliceLayerParams *)local_58);
  iVar4 = (int)uVar8;
  SVar3 = Specification::SliceLayerParams::axis((SliceLayerParams *)local_58);
  uVar2 = slice._40_8_;
  iStack_7c = 0;
  local_80 = SliceLayerParams_SliceAxis_CHANNEL_AXIS;
  bVar1 = false;
  if ((local_5c < 0) || (axis < SliceLayerParams_SliceAxis_HEIGHT_AXIS)) {
    if ((local_5c < 0) && (axis < SliceLayerParams_SliceAxis_HEIGHT_AXIS)) {
      bVar1 = true;
      local_80 = -local_5c;
      iStack_7c = ((-1 - local_5c) + axis) / iVar4 + 1;
    }
  }
  else {
    bVar1 = true;
    iStack_7c = ((axis + (
                         SliceLayerParams_SliceAxis_SliceLayerParams_SliceAxis_INT_MIN_SENTINEL_DO_NOT_USE_
                         |
                         SliceLayerParams_SliceAxis_SliceLayerParams_SliceAxis_INT_MAX_SENTINEL_DO_NOT_USE_
                         )) - local_5c) / iVar4 + 1;
    local_80 = axis;
  }
  if (bVar1) {
    if (SVar3 == SliceLayerParams_SliceAxis_CHANNEL_AXIS) {
      ShapeConstraint::setChannel((ShapeConstraint *)slice._40_8_,(long)iStack_7c);
      uVar2 = slice._40_8_;
      pSVar6 = ShapeConstraint::heightRange(this_00);
      ShapeConstraint::updateHeightRange((ShapeConstraint *)uVar2,pSVar6);
      uVar2 = slice._40_8_;
      pSVar6 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange((ShapeConstraint *)uVar2,pSVar6);
      ShapeConstraint::lowerBoundChannel(this_00,(long)local_80);
      pSVar6 = ShapeConstraint::heightRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateHeightRange(this_00,pSVar6);
      pSVar6 = ShapeConstraint::widthRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateWidthRange(this_00,pSVar6);
    }
    else if (SVar3 == SliceLayerParams_SliceAxis_HEIGHT_AXIS) {
      pSVar6 = ShapeConstraint::channelRange(this_00);
      ShapeConstraint::updateChannelRange((ShapeConstraint *)uVar2,pSVar6);
      ShapeConstraint::setHeight((ShapeConstraint *)slice._40_8_,(long)iStack_7c);
      uVar2 = slice._40_8_;
      pSVar6 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange((ShapeConstraint *)uVar2,pSVar6);
      pSVar6 = ShapeConstraint::channelRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateChannelRange(this_00,pSVar6);
      ShapeConstraint::lowerBoundHeight(this_00,(long)local_80);
      pSVar6 = ShapeConstraint::widthRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateWidthRange(this_00,pSVar6);
    }
    else {
      if (SVar3 != SliceLayerParams_SliceAxis_WIDTH_AXIS) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar9,"Slice layer axis incorrect -- should be caught in validator.");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pSVar6 = ShapeConstraint::channelRange(this_00);
      ShapeConstraint::updateChannelRange((ShapeConstraint *)uVar2,pSVar6);
      uVar2 = slice._40_8_;
      pSVar6 = ShapeConstraint::heightRange(this_00);
      ShapeConstraint::updateHeightRange((ShapeConstraint *)uVar2,pSVar6);
      ShapeConstraint::setWidth((ShapeConstraint *)slice._40_8_,(long)iStack_7c);
      pSVar6 = ShapeConstraint::channelRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateChannelRange(this_00,pSVar6);
      pSVar6 = ShapeConstraint::heightRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateHeightRange(this_00,pSVar6);
      ShapeConstraint::lowerBoundWidth(this_00,(long)local_80);
    }
  }
  else {
    ShapeRange::ShapeRange((ShapeRange *)&outrange._maximum._val);
    if (SVar3 == SliceLayerParams_SliceAxis_CHANNEL_AXIS) {
      pSVar6 = ShapeConstraint::channelRange(this_00);
      outrange._maximum._val = *(size_t *)&pSVar6->_minimum;
    }
    else if (SVar3 == SliceLayerParams_SliceAxis_HEIGHT_AXIS) {
      pSVar6 = ShapeConstraint::heightRange(this_00);
      outrange._maximum._val = *(size_t *)&pSVar6->_minimum;
    }
    else {
      if (SVar3 != SliceLayerParams_SliceAxis_WIDTH_AXIS) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar9,"Slice layer axis incorrect -- should be caught in validator.");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pSVar6 = ShapeConstraint::widthRange(this_00);
      outrange._maximum._val = *(size_t *)&pSVar6->_minimum;
    }
    if (axis < SliceLayerParams_SliceAxis_HEIGHT_AXIS) {
      axis = -axis;
    }
    else {
      local_5c = -local_5c;
    }
    ShapeRange::operator-(&local_108,(ShapeRange *)&outrange._maximum._val,local_5c + 1 + axis);
    ShapeRange::operator/(&local_e8,&local_108,iVar4);
    ShapeRange::operator+((ShapeRange *)local_c8,&local_e8,1);
    uVar2 = slice._40_8_;
    iVar4 = local_5c + 1 + axis;
    if (SVar3 == SliceLayerParams_SliceAxis_CHANNEL_AXIS) {
      ShapeConstraint::updateChannelRange((ShapeConstraint *)slice._40_8_,(ShapeRange *)local_c8);
      uVar2 = slice._40_8_;
      pSVar6 = ShapeConstraint::heightRange(this_00);
      ShapeConstraint::updateHeightRange((ShapeConstraint *)uVar2,pSVar6);
      uVar2 = slice._40_8_;
      pSVar6 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange((ShapeConstraint *)uVar2,pSVar6);
      ShapeConstraint::lowerBoundChannel(this_00,(long)iVar4);
      pSVar6 = ShapeConstraint::heightRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateHeightRange(this_00,pSVar6);
      pSVar6 = ShapeConstraint::widthRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateWidthRange(this_00,pSVar6);
    }
    else if (SVar3 == SliceLayerParams_SliceAxis_HEIGHT_AXIS) {
      pSVar6 = ShapeConstraint::channelRange(this_00);
      ShapeConstraint::updateChannelRange((ShapeConstraint *)uVar2,pSVar6);
      ShapeConstraint::updateHeightRange((ShapeConstraint *)slice._40_8_,(ShapeRange *)local_c8);
      uVar2 = slice._40_8_;
      pSVar6 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange((ShapeConstraint *)uVar2,pSVar6);
      pSVar6 = ShapeConstraint::channelRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateChannelRange(this_00,pSVar6);
      ShapeConstraint::lowerBoundHeight(this_00,(long)iVar4);
      pSVar6 = ShapeConstraint::widthRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateWidthRange(this_00,pSVar6);
    }
    else {
      if (SVar3 != SliceLayerParams_SliceAxis_WIDTH_AXIS) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar9,"Slice layer axis incorrect -- should be caught in validator.");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pSVar6 = ShapeConstraint::channelRange(this_00);
      ShapeConstraint::updateChannelRange((ShapeConstraint *)uVar2,pSVar6);
      uVar2 = slice._40_8_;
      pSVar6 = ShapeConstraint::heightRange(this_00);
      ShapeConstraint::updateHeightRange((ShapeConstraint *)uVar2,pSVar6);
      ShapeConstraint::updateWidthRange((ShapeConstraint *)slice._40_8_,(ShapeRange *)local_c8);
      pSVar6 = ShapeConstraint::channelRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateChannelRange(this_00,pSVar6);
      pSVar6 = ShapeConstraint::heightRange((ShapeConstraint *)slice._40_8_);
      ShapeConstraint::updateHeightRange(this_00,pSVar6);
      ShapeConstraint::lowerBoundWidth(this_00,(long)iVar4);
    }
  }
  Specification::SliceLayerParams::~SliceLayerParams((SliceLayerParams *)local_58);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSliceLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Slice layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Slice layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(inputShape.sequenceRange());
    outputShape.updateBatchRange(inputShape.batchRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

    Specification::SliceLayerParams slice = specLayer.slice();
    int start = static_cast<int>(slice.startindex());
    int end = static_cast<int>(slice.endindex());
    int stride = static_cast<int>(slice.stride());
    auto axis = slice.axis();

    int outsize = 0;
    int inLowerBound = 0;
    bool fixedSize = false;

    if (start >= 0 && end > 0) {
        fixedSize = true;
        outsize = (end - 1 - start) / stride + 1;
        inLowerBound = end;
    }
    else if (start < 0 && end <= 0) {
        fixedSize = true;
        inLowerBound = -1*start;
        outsize = (-start - 1 + end) / stride + 1;
    }

    // TODO: add check that this size is possible from the input size

    if (fixedSize) {
        switch (axis) {
            case Specification::SliceLayerParams::CHANNEL_AXIS:
                outputShape.setChannel(static_cast<size_t>(outsize));
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.lowerBoundChannel(static_cast<size_t>(inLowerBound));
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            case Specification::SliceLayerParams::HEIGHT_AXIS:
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.setHeight(static_cast<size_t>(outsize));
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.lowerBoundHeight(static_cast<size_t>(inLowerBound));
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            case Specification::SliceLayerParams::WIDTH_AXIS:
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.setWidth(static_cast<size_t>(outsize));

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.lowerBoundWidth(static_cast<size_t>(inLowerBound));

                break;
            default:
                throw std::runtime_error("Slice layer axis incorrect -- should be caught in validator.");
                break;
        }
    }
    else {
        ShapeRange size;
        switch (axis) {
            case Specification::SliceLayerParams::CHANNEL_AXIS:
                size = inputShape.channelRange();
                break;
            case Specification::SliceLayerParams::HEIGHT_AXIS:
                size = inputShape.heightRange();
                break;
            case Specification::SliceLayerParams::WIDTH_AXIS:
                size = inputShape.widthRange();
                break;
            default:
                throw std::runtime_error("Slice layer axis incorrect -- should be caught in validator.");
                break;
        }

        if (end <= 0) {
            end = (-1*end);
        }
        else { // start <=0, we already took the case where they have the same size
            start = (-1*start);
        }

        ShapeRange outrange = (size - (start + 1 + end)) / stride + 1;

        inLowerBound = start + 1 + end;

        switch (axis) {
            case Specification::SliceLayerParams::CHANNEL_AXIS: {
                outputShape.updateChannelRange(outrange);
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.lowerBoundChannel(static_cast<size_t>(inLowerBound));
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            }
            case Specification::SliceLayerParams::HEIGHT_AXIS: {
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.updateHeightRange(outrange);
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.lowerBoundHeight(static_cast<size_t>(inLowerBound));
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            }
            case Specification::SliceLayerParams::WIDTH_AXIS: {
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.updateWidthRange(outrange);

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.lowerBoundWidth(static_cast<size_t>(inLowerBound));

                break;
            }
            default: {
                throw std::runtime_error("Slice layer axis incorrect -- should be caught in validator.");
                break;
            }
        }

    } // signs don't match

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Slice layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Slice layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}